

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O0

ImVec4 * __thiscall ImVector<ImVec4>::insert(ImVector<ImVec4> *this,ImVec4 *it,ImVec4 *v)

{
  bool bVar1;
  float fVar2;
  int new_capacity;
  long lVar3;
  ImVec4 *pIVar4;
  ptrdiff_t off;
  ImVec4 *v_local;
  ImVec4 *it_local;
  ImVector<ImVec4> *this_local;
  
  bVar1 = false;
  if (this->Data <= it) {
    bVar1 = it <= this->Data + this->Size;
  }
  if (!bVar1) {
    __assert_fail("it >= Data && it <= Data+Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/./imgui/imgui.h"
                  ,0x4f2,"T *ImVector<ImVec4>::insert(const T *, const T &) [T = ImVec4]");
  }
  lVar3 = (long)it - (long)this->Data >> 4;
  if (this->Size == this->Capacity) {
    new_capacity = _grow_capacity(this,this->Size + 1);
    reserve(this,new_capacity);
  }
  if (lVar3 < this->Size) {
    memmove(this->Data + lVar3 + 1,this->Data + lVar3,(this->Size - lVar3) * 0x10);
  }
  pIVar4 = this->Data + lVar3;
  fVar2 = v->y;
  pIVar4->x = v->x;
  pIVar4->y = fVar2;
  fVar2 = v->w;
  pIVar4->z = v->z;
  pIVar4->w = fVar2;
  this->Size = this->Size + 1;
  return this->Data + lVar3;
}

Assistant:

inline T*           insert(const T* it, const T& v)     { IM_ASSERT(it >= Data && it <= Data+Size); const ptrdiff_t off = it - Data; if (Size == Capacity) reserve(_grow_capacity(Size + 1)); if (off < (int)Size) memmove(Data + off + 1, Data + off, ((size_t)Size - (size_t)off) * sizeof(T)); memcpy(&Data[off], &v, sizeof(v)); Size++; return Data + off; }